

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O2

void __thiscall
glcts::ViewportArray::Utils::texture::update
          (texture *this,GLuint width,GLuint height,GLuint depth,GLenum format,GLenum type,
          GLvoid *data)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 in_register_0000000c;
  undefined8 uVar3;
  sockaddr *__addr;
  GLuint __fd;
  undefined4 in_register_00000084;
  long lVar2;
  
  uVar3 = CONCAT44(in_register_0000000c,depth);
  __fd = width;
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  bind(this,__fd,__addr,(socklen_t)uVar3);
  if (this->m_is_array == false) {
    (**(code **)(lVar2 + 0x13b8))
              (0xde1,0,0,0,width,height,CONCAT44(in_register_00000084,format),type,data);
    iVar1 = 0x389;
  }
  else {
    (**(code **)(lVar2 + 0x13c0))
              (0x8c1a,0,0,0,0,width,height,CONCAT44(in_register_0000000c,depth),
               CONCAT44(in_register_00000084,format),type,data);
    iVar1 = 0x38f;
  }
  err = (**(code **)(lVar2 + 0x800))();
  glu::checkError(err,"TexStorage2D",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                  ,iVar1);
  return;
}

Assistant:

void Utils::texture::update(glw::GLuint width, glw::GLuint height, glw::GLuint depth, glw::GLenum format,
							glw::GLenum type, glw::GLvoid* data)
{
	static const GLuint level = 0;

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	bind();

	if (false == m_is_array)
	{
		gl.texSubImage2D(GL_TEXTURE_2D, level, 0 /* x */, 0 /* y */, width, height, format, type, data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage2D");
	}
	else
	{
		gl.texSubImage3D(GL_TEXTURE_2D_ARRAY, level, 0 /* x */, 0 /* y */, 0 /* z */, width, height, depth, format,
						 type, data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage2D");
	}
}